

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

void duckdb::ListCombineFunction
               (Vector *states_vector,Vector *combined,AggregateInputData *aggr_input_data,
               idx_t count)

{
  data_ptr_t pdVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  FunctionData *pFVar5;
  LinkedList *linked_list;
  LinkedList *linked_list_00;
  LogicalType *other;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  idx_t iVar9;
  ListSegmentFunctions *this;
  LogicalType result_type;
  RecursiveUnifiedVectorFormat input_data;
  UnifiedVectorFormat states_data;
  Vector input;
  idx_t local_1b0;
  ulong local_1a8;
  data_ptr_t local_1a0;
  data_ptr_t local_198;
  ulong local_190;
  LogicalType local_188;
  RecursiveUnifiedVectorFormat local_170;
  LogicalType local_f8;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  if (aggr_input_data->combine_type == ALLOW_DESTRUCTIVE) {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_170.unified);
    Vector::ToUnifiedFormat(states_vector,count,&local_170.unified);
    if (count != 0) {
      pdVar1 = combined->data;
      iVar7 = 0;
      do {
        iVar9 = iVar7;
        if ((local_170.unified.sel)->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)(local_170.unified.sel)->sel_vector[iVar7];
        }
        plVar2 = *(long **)(local_170.unified.data + iVar9 * 8);
        lVar3 = *plVar2;
        if (lVar3 != 0) {
          plVar4 = *(long **)(pdVar1 + iVar7 * 8);
          if (*plVar4 == 0) {
            plVar4[2] = plVar2[2];
            lVar3 = plVar2[1];
            *plVar4 = *plVar2;
            plVar4[1] = lVar3;
          }
          else {
            *(long *)(plVar4[2] + 8) = plVar2[1];
            *(long *)(*(long *)(pdVar1 + iVar7 * 8) + 0x10) = plVar2[2];
            **(long **)(pdVar1 + iVar7 * 8) = **(long **)(pdVar1 + iVar7 * 8) + lVar3;
          }
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_170.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
         internal.
         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_170.unified.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.unified.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_170.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
           internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
    Vector::ToUnifiedFormat(states_vector,count,&local_e0);
    local_198 = local_e0.data;
    local_1a0 = combined->data;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
    pFVar5 = (aggr_input_data->bind_data).ptr;
    other = ListType::GetChildType((LogicalType *)(pFVar5 + 1));
    LogicalType::LogicalType(&local_188,other);
    if (count != 0) {
      this = (ListSegmentFunctions *)(pFVar5 + 4);
      uVar8 = 0;
      local_1a8 = count;
      do {
        uVar6 = uVar8;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)(local_e0.sel)->sel_vector[uVar8];
        }
        linked_list = *(LinkedList **)(local_198 + uVar6 * 8);
        linked_list_00 = *(LinkedList **)(local_1a0 + uVar8 * 8);
        iVar7 = linked_list->total_capacity;
        local_190 = uVar8;
        LogicalType::LogicalType(&local_f8,&local_188);
        Vector::Vector(&local_98,&local_f8,linked_list->total_capacity);
        LogicalType::~LogicalType(&local_f8);
        ListSegmentFunctions::BuildListVector(this,linked_list,&local_98,0);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_170.unified);
        local_170.children.
        super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        .
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_170.children.
        super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        .
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170.children.
        super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        .
        super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LogicalType::LogicalType(&local_170.logical_type);
        Vector::RecursiveToUnifiedFormat(&local_98,iVar7,&local_170);
        local_1b0 = 0;
        if (iVar7 != 0) {
          do {
            ArenaAllocator::AlignNext(aggr_input_data->allocator);
            ListSegmentFunctions::AppendRow
                      (this,aggr_input_data->allocator,linked_list_00,&local_170,&local_1b0);
            local_1b0 = local_1b0 + 1;
          } while (local_1b0 < iVar7);
        }
        LogicalType::~LogicalType(&local_170.logical_type);
        ::std::
        vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
        ::~vector(&local_170.children.
                   super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
                 );
        if (local_170.unified.owned_sel.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.unified.owned_sel.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar6 = local_1a8;
        if (local_170.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
            internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_170.unified.validity.super_TemplatedValidityMask<unsigned_long>.
                     validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_98.auxiliary.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.auxiliary.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.buffer.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.buffer.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        LogicalType::~LogicalType(&local_98.type);
        uVar8 = local_190 + 1;
      } while (uVar8 != uVar6);
    }
    LogicalType::~LogicalType(&local_188);
    if (local_e0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListCombineFunction(Vector &states_vector, Vector &combined, AggregateInputData &aggr_input_data,
                                idx_t count) {

	//	Can we use destructive combining?
	if (aggr_input_data.combine_type == AggregateCombineType::ALLOW_DESTRUCTIVE) {
		ListAbsorbFunction(states_vector, combined, aggr_input_data, count);
		return;
	}

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states_ptr = UnifiedVectorFormat::GetData<const ListAggState *>(states_data);
	auto combined_ptr = FlatVector::GetData<ListAggState *>(combined);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();
	auto result_type = ListType::GetChildType(list_bind_data.stype);

	for (idx_t i = 0; i < count; i++) {
		auto &source = *states_ptr[states_data.sel->get_index(i)];
		auto &target = *combined_ptr[i];

		const auto entry_count = source.linked_list.total_capacity;
		Vector input(result_type, source.linked_list.total_capacity);
		list_bind_data.functions.BuildListVector(source.linked_list, input, 0);

		RecursiveUnifiedVectorFormat input_data;
		Vector::RecursiveToUnifiedFormat(input, entry_count, input_data);

		for (idx_t entry_idx = 0; entry_idx < entry_count; ++entry_idx) {
			aggr_input_data.allocator.AlignNext();
			list_bind_data.functions.AppendRow(aggr_input_data.allocator, target.linked_list, input_data, entry_idx);
		}
	}
}